

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stage2RunnerNonRecursive.hpp
# Opt level: O0

void * __thiscall Centaurus::Stage2Runner::acquire_bank(Stage2Runner *this)

{
  bool bVar1;
  WindowBankState local_28;
  int local_24;
  WindowBankState old_state;
  int i;
  WindowBankEntry *banks;
  Stage2Runner *this_local;
  
  banks = (WindowBankEntry *)this;
  BaseRunner::wait_on_semaphore((BaseRunner *)this);
  _old_state = (this->super_NonRecursiveReductionRunner).super_BaseRunner.m_sub_window;
  do {
    for (local_24 = 0;
        local_24 < (this->super_NonRecursiveReductionRunner).super_BaseRunner.m_bank_num;
        local_24 = local_24 + 1) {
      local_28 = Stage1_Unlocked;
      bVar1 = std::atomic<Centaurus::BaseRunner::WindowBankState>::compare_exchange_weak
                        ((atomic<Centaurus::BaseRunner::WindowBankState> *)
                         ((long)_old_state + (long)local_24 * 8 + 4),&local_28,Stage2_Locked,
                         memory_order_seq_cst);
      if (bVar1) {
        NonRecursiveReductionRunner::invoke_transfer_listener
                  (&this->super_NonRecursiveReductionRunner,-1,
                   *(int *)((long)_old_state + (long)local_24 * 8));
        this->m_current_bank = local_24;
        return (void *)((long)(this->super_NonRecursiveReductionRunner).super_BaseRunner.
                              m_main_window +
                       (this->super_NonRecursiveReductionRunner).super_BaseRunner.m_bank_size *
                       (long)local_24);
      }
      if (local_28 == YouAreDone) {
        return (void *)0x0;
      }
    }
  } while( true );
}

Assistant:

void *acquire_bank()
  {
    wait_on_semaphore();
    WindowBankEntry *banks = reinterpret_cast<WindowBankEntry *>(m_sub_window);
    while (true) {
      for (int i = 0; i < m_bank_num; i++) {
        WindowBankState old_state = WindowBankState::Stage1_Unlocked;
        if (banks[i].state.compare_exchange_weak(old_state, WindowBankState::Stage2_Locked)) {
          invoke_transfer_listener(-1, banks[i].number);
          m_current_bank = i;
          return (char *)m_main_window + m_bank_size * i;
        } else {
          if (old_state == WindowBankState::YouAreDone) {
            return NULL;
          }
        }
      }
    }
  }